

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<chaiscript::Boxed_Value>::operator()<>
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value> *this)

{
  Type_Conversions *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Function_Params *in_RSI;
  Boxed_Value BVar2;
  Type_Conversions_State state_1;
  Type_Conversions_State state;
  Type_Conversions_State local_e8;
  Type_Conversions_State local_d8;
  pthread_rwlock_t local_c8;
  _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  _Stack_90;
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  _Stack_60;
  undefined8 uStack_30;
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  local_28;
  Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  this_00 = (Type_Conversions *)in_RSI[1].m_end;
  if (this_00 == (Type_Conversions *)0x0) {
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &_Stack_90._M_impl.super__Rb_tree_header._M_header;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._48_8_ = 0;
    _Stack_90._M_impl._0_8_ = 0;
    local_c8._32_8_ = 0;
    local_c8.__data.__pad2 = 0;
    local_c8._16_8_ = 0;
    local_c8._24_8_ = 0;
    local_c8.__align = 0;
    local_c8._8_8_ = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &_Stack_60._M_impl.super__Rb_tree_header._M_header;
    _Stack_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_60._M_impl._0_8_ = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    uStack_30 = 0;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_e8.m_saves._M_data =
         Type_Conversions::conversion_saves((Type_Conversions *)&local_c8.__data);
    local_d8.m_conversions._M_data = (Type_Conversions *)0x0;
    local_d8.m_saves._M_data = (Conversion_Saves *)0x0;
    local_e8.m_conversions._M_data = (Type_Conversions *)&local_c8;
    call(this,in_RSI,&local_d8);
    chaiscript::detail::threading::Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::
    ~Thread_Storage(&local_20);
    chaiscript::detail::threading::
    Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
    ::~Thread_Storage(&local_28);
    std::
    _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
    ::~_Rb_tree(&_Stack_60);
    std::
    _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
    ::~_Rb_tree(&_Stack_90);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    local_c8._8_8_ = Type_Conversions::conversion_saves(this_00);
    local_e8.m_conversions._M_data = (Type_Conversions *)0x0;
    local_e8.m_saves._M_data = (Conversion_Saves *)0x0;
    local_c8.__align = (long)this_00;
    BVar2 = call(this,in_RSI,&local_e8);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P &&...param) {
      std::array<Boxed_Value, sizeof...(P)> params{box<P>(std::forward<P>(param))...};

      if (m_conversions) {
        Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      } else {
        Type_Conversions conv;
        Type_Conversions_State state(conv, conv.conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      }
    }